

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O1

void __thiscall
Assimp::FBX::Node::AddChild<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (Node *this,string *name,vector<unsigned_char,_std::allocator<unsigned_char>_> *more)

{
  pointer pcVar1;
  Node c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined1 local_90 [32];
  pointer local_70;
  pointer pFStack_68;
  pointer local_60;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> vStack_58;
  bool local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + name->_M_string_length);
  vStack_58.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_58.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = (pointer)0x0;
  vStack_58.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70 = (pointer)0x0;
  pFStack_68 = (pointer)0x0;
  local_40 = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,more);
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&local_70,&local_a8);
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_90);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&vStack_58);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector((vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_> *
          )&local_70);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }